

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void OPLL_Channel(opll_t *chip)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  short local_18;
  short local_12;
  int16_t sign;
  uint8_t mute_r;
  uint8_t mute_m;
  uint8_t ismod;
  int16_t ch_out;
  opll_t *chip_local;
  
  local_12 = chip->ch_out;
  bVar3 = true;
  if ((((ulong)chip->cycles / 3 & 1) == 0) && (bVar3 = false, (chip->rm_enable & 0x40U) != 0)) {
    bVar3 = 0xb < (chip->cycles + 0xf) % 0x12;
  }
  if (chip->chip_type == 1) {
    chip->output_m = local_12;
    if (-1 < chip->output_m) {
      chip->output_m = chip->output_m + 1;
    }
    if (bVar3) {
      chip->output_m = 0;
    }
    chip->output_r = 0;
  }
  else {
    bVar2 = true;
    if (((chip->rm_enable & 0x40U) != 0) &&
       (((uVar1 = chip->cycles, uVar1 < 6 || (uVar1 - 9 < 2)) || (uVar1 == 0x10 || uVar1 == 0x11))))
    {
      bVar2 = false;
    }
    if ((chip->chip_type == 2) || (chip->chip_type == 4)) {
      if (bVar3) {
        chip->output_m = 0;
      }
      else {
        chip->output_m = local_12;
      }
      if (bVar2) {
        chip->output_r = 0;
      }
      else {
        chip->output_r = local_12;
      }
    }
    else {
      local_18 = (short)(char)((ushort)local_12 >> 8);
      if (-1 < local_12) {
        local_12 = local_12 + 1;
        local_18 = local_18 + 1;
      }
      if (bVar3) {
        chip->output_m = local_18;
      }
      else {
        chip->output_m = local_12;
      }
      if (bVar2) {
        chip->output_r = local_18;
      }
      else {
        chip->output_r = local_12;
      }
    }
  }
  return;
}

Assistant:

static void OPLL_Channel(opll_t *chip) {
    int16_t ch_out = chip->ch_out;
    uint8_t ismod = (chip->cycles / 3) & 1;
    uint8_t mute_m = ismod || ((chip->rm_enable&0x40) && (chip->cycles+15)%18 >= 12);
    if (chip->chip_type == opll_type_ds1001) {
        chip->output_m = ch_out;
        if (chip->output_m >= 0) {
            chip->output_m++;
        }
        if (mute_m) {
            chip->output_m = 0;
        }
        chip->output_r = 0;
        return;
    } else {
        uint8_t mute_r = 1;
        /* TODO: This might be incorrect */
        if ((chip->rm_enable & 0x40)) {
            switch (chip->cycles) {
            case 16: /* HH */
            case 17: /* TOM */
            case 0: /* BD */
            case 1: /* SD */
            case 2: /* TC */
            case 3: /* HH */
            case 4: /* TOM */
            case 5: /* BD */
            case 9: /* TOM */
            case 10: /* TOM */
                mute_r = 0;
                break;
            }
        }
        if (chip->chip_type == opll_type_ym2413b || chip->chip_type == opll_type_ymf281b) {
            if (mute_m)
                chip->output_m = 0;
            else
                chip->output_m = ch_out;
            if (mute_r)
                chip->output_r = 0;
            else
                chip->output_r = ch_out;
        } else {
            int16_t sign = ch_out >> 8;
            if (ch_out >= 0) {
                ch_out++;
                sign++;
            }
            if (mute_m)
                chip->output_m = sign;
            else
                chip->output_m = ch_out;
            if (mute_r)
                chip->output_r = sign;
            else
                chip->output_r = ch_out;
        }
    }
}